

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_p.h
# Opt level: O0

QString * __thiscall QLocaleData::DataRange::getData(DataRange *this,char16_t *table)

{
  char16_t *in_RDX;
  DataRange *in_RSI;
  QString *in_RDI;
  QString *unicode;
  
  if (in_RSI->size == 0) {
    QString::QString((QString *)0x14821e);
  }
  else {
    unicode = in_RDI;
    stringStart(in_RSI,in_RDX);
    stringSize(in_RSI);
    QString::fromRawData((QChar *)unicode,(qsizetype)in_RDI);
    in_RDI = unicode;
  }
  return in_RDI;
}

Assistant:

[[nodiscard]] QString getData(const char16_t *table) const
        {
            return size > 0
                ? QString::fromRawData(stringStart(table), stringSize())
                : QString();
        }